

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

string * nonius::trim_copy_if<nonius::detail::is_spaceF>(string *__return_storage_ptr__,long *input)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<nonius::detail::is_spaceF>>
                    (*input,input[1] + *input);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<nonius::detail::is_spaceF>>
                    (_Var1._M_current,*input + input[1]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,_Var1._M_current,_Var2._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::string trim_copy_if(std::string const& input, PredicateT predicate) {
        const auto begin = std::find_if_not(input.begin(), input.end(), predicate);
        const auto end = std::find_if(begin, input.end(), predicate);
        return std::string(begin, end);
    }